

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::IsPathToXcFramework(string *path)

{
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  if (bVar1) {
    local_18._M_str = (path->_M_dataplus)._M_p;
    local_18._M_len = path->_M_string_length;
    if (0xb < local_18._M_len) {
      __str._M_str = ".xcframework";
      __str._M_len = 0xc;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_18,local_18._M_len - 0xc,0xc,__str);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool cmSystemTools::IsPathToXcFramework(const std::string& path)
{
  return (cmSystemTools::FileIsFullPath(path) &&
          cmHasLiteralSuffix(path, ".xcframework"));
}